

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

bool __thiscall
OSTEI_VRR_Algorithm_Base::HasVRROfType(OSTEI_VRR_Algorithm_Base *this,RRStepType steptype)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  
  p_Var3 = (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar1 = (_Rb_tree_header *)p_Var3 != &(this->vrrmap_)._M_t._M_impl.super__Rb_tree_header;
    if (!bVar1) {
      return bVar1;
    }
    for (p_Var2 = p_Var3[3]._M_parent; bVar4 = p_Var2 != (_Base_ptr)&p_Var3[2]._M_right, bVar4;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2[1]._M_color == steptype) {
        if (bVar4) {
          return bVar1;
        }
        break;
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool OSTEI_VRR_Algorithm_Base::HasVRROfType(RRStepType steptype) const
{
    for(const auto & it : vrrmap_)
    {
        for(const auto & it2 : it.second)
        {
            if(it2.type == steptype)
                return true;
        }
    }

    return false;
}